

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O3

void extract_cond_isotree
               (IsoForest *model,IsoTree *tree,string *cond_left,string *cond_right,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *numeric_colnames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *categ_colnames,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *categ_levels)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  pointer pcVar6;
  pointer pbVar7;
  long *plVar8;
  undefined8 *puVar9;
  pointer pcVar10;
  runtime_error *this;
  size_type *psVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  IsoForest *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_c0 = cond_right;
  local_b8 = model;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  std::__cxx11::string::operator=((string *)local_c0,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (tree->tree_left == 0) {
    return;
  }
  if (tree->col_type == Categorical) {
    if (local_b8->cat_split_type == SubSet) {
      pbVar7 = (categ_colnames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &local_160.field_2;
      pcVar6 = pbVar7[tree->col_num]._M_dataplus._M_p;
      local_160._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar6,pcVar6 + pbVar7[tree->col_num]._M_string_length);
      std::__cxx11::string::append((char *)&local_160);
      std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar1) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)local_c0);
      if (local_b8->missing_action == Impute) {
        if (0.5 <= tree->pct_tree_left) {
          pbVar7 = (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          paVar2 = &local_140.field_2;
          pcVar6 = pbVar7[tree->col_num]._M_dataplus._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar6,pcVar6 + pbVar7[tree->col_num]._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)(cond_left->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160.field_2._8_8_ = plVar8[3];
            local_160._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_160._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar1) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          pbVar7 = (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pcVar6 = pbVar7[tree->col_num]._M_dataplus._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar6,pcVar6 + pbVar7[tree->col_num]._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)(local_c0->_M_dataplus)._M_p);
        }
        else {
          pbVar7 = (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          paVar2 = &local_140.field_2;
          pcVar6 = pbVar7[tree->col_num]._M_dataplus._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar6,pcVar6 + pbVar7[tree->col_num]._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)(cond_left->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160.field_2._8_8_ = plVar8[3];
            local_160._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar11;
            local_160._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_160._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar1) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          pbVar7 = (categ_colnames->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pcVar6 = pbVar7[tree->col_num]._M_dataplus._M_p;
          local_140._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar6,pcVar6 + pbVar7[tree->col_num]._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)(local_c0->_M_dataplus)._M_p);
        }
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_160.field_2._M_allocated_capacity = *psVar11;
          local_160.field_2._8_8_ = plVar8[3];
          local_160._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar11;
          local_160._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_160._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar1) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar10 = (tree->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((tree->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish == pcVar10) {
        std::__cxx11::string::_M_replace
                  ((ulong)cond_left,0,(char *)cond_left->_M_string_length,0x373bc2);
      }
      else {
        lVar14 = 8;
        uVar13 = 0;
        bVar18 = false;
        bVar19 = false;
        do {
          cVar5 = pcVar10[uVar13];
          if (cVar5 == '\0') {
            pcVar15 = "";
            if (bVar18) {
              pcVar15 = ", ";
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,pcVar15,pcVar15 + (ulong)bVar18 * 2);
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            psVar11 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100.field_2._8_8_ = puVar9[3];
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_100._M_string_length = puVar9[1];
            *puVar9 = psVar11;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_100,
                                        *(ulong *)(*(long *)&(categ_levels->
                                                                                                                          
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + -8 + lVar14));
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_140.field_2._M_allocated_capacity = *psVar11;
              local_140.field_2._8_8_ = plVar8[3];
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar11;
              local_140._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_140._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160.field_2._8_8_ = plVar8[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_160._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_160._M_dataplus._M_p);
LAB_00352797:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            bVar18 = true;
          }
          else if (cVar5 == -1) {
            if (local_b8->missing_action == Impute || local_b8->new_cat_action == Smallest) {
              if (((local_b8->new_cat_action != Smallest) || (0.5 <= tree->pct_tree_left)) &&
                 ((local_b8->missing_action != Impute || (tree->pct_tree_left < 0.5)))) {
                pcVar15 = "";
                if (bVar18 != false) {
                  pcVar15 = ", ";
                }
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_120,pcVar15,pcVar15 + (ulong)bVar18 * 2);
                puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                psVar11 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_100.field_2._M_allocated_capacity = *psVar11;
                  local_100.field_2._8_8_ = puVar9[3];
                }
                else {
                  local_100.field_2._M_allocated_capacity = *psVar11;
                  local_100._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_100._M_string_length = puVar9[1];
                *puVar9 = psVar11;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_100,
                                    *(ulong *)(*(long *)&(categ_levels->
                                                                                                                  
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + -8 + lVar14));
                psVar11 = puVar9 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_140.field_2._M_allocated_capacity = *psVar11;
                  local_140.field_2._8_8_ = puVar9[3];
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                }
                else {
                  local_140.field_2._M_allocated_capacity = *psVar11;
                  local_140._M_dataplus._M_p = (pointer)*puVar9;
                }
                local_140._M_string_length = puVar9[1];
                *puVar9 = psVar11;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                psVar11 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_160.field_2._M_allocated_capacity = *psVar11;
                  local_160.field_2._8_8_ = plVar8[3];
                }
                else {
                  local_160.field_2._M_allocated_capacity = *psVar11;
                  local_160._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_160._M_string_length = plVar8[1];
                *plVar8 = (long)psVar11;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_160._M_dataplus._M_p);
                goto LAB_00352797;
              }
              pcVar15 = "";
              if (bVar19 != false) {
                pcVar15 = ", ";
              }
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,pcVar15,pcVar15 + (ulong)bVar19 * 2);
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              psVar11 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_100.field_2._M_allocated_capacity = *psVar11;
                local_100.field_2._8_8_ = puVar9[3];
              }
              else {
                local_100.field_2._M_allocated_capacity = *psVar11;
                local_100._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_100._M_string_length = puVar9[1];
              *puVar9 = psVar11;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_100,
                                  *(ulong *)(*(long *)&(categ_levels->
                                                                                                              
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + -8 + lVar14));
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar11 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_140.field_2._M_allocated_capacity = *psVar11;
                local_140.field_2._8_8_ = puVar9[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar11;
                local_140._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_140._M_string_length = puVar9[1];
              *puVar9 = psVar11;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              psVar11 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160.field_2._8_8_ = plVar8[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar11;
                local_160._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_160._M_string_length = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)cond_left,(ulong)local_160._M_dataplus._M_p);
              goto LAB_0035293f;
            }
          }
          else if (cVar5 == '\x01') {
            pcVar15 = "";
            if (bVar19) {
              pcVar15 = ", ";
            }
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,pcVar15,pcVar15 + (ulong)bVar19 * 2);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100.field_2._8_8_ = plVar8[3];
            }
            else {
              local_100.field_2._M_allocated_capacity = *psVar11;
              local_100._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_100._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_100,
                                *(ulong *)(*(long *)&(categ_levels->
                                                                                                          
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + -8 + lVar14));
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            psVar11 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_140.field_2._M_allocated_capacity = *psVar11;
              local_140.field_2._8_8_ = puVar9[3];
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar11;
              local_140._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_140._M_string_length = puVar9[1];
            *puVar9 = psVar11;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160.field_2._8_8_ = plVar8[3];
            }
            else {
              local_160.field_2._M_allocated_capacity = *psVar11;
              local_160._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_160._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::_M_append((char *)cond_left,(ulong)local_160._M_dataplus._M_p);
LAB_0035293f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            bVar19 = true;
          }
          uVar13 = uVar13 + 1;
          pcVar10 = (tree->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x20;
        } while (uVar13 < (ulong)((long)(tree->cat_split).
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar10))
        ;
        if (bVar19 == false) {
          std::__cxx11::string::_M_replace
                    ((ulong)cond_left,0,(char *)cond_left->_M_string_length,0x373bc2);
        }
        else {
          std::__cxx11::string::append((char *)cond_left);
        }
        if (bVar18 != false) {
          std::__cxx11::string::append((char *)local_c0);
          return;
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_c0,0,(char *)local_c0->_M_string_length,0x373bc2);
      return;
    }
    if (local_b8->cat_split_type != SingleCateg) {
      return;
    }
    if (local_b8->missing_action == Impute) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      pbVar7 = (categ_colnames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + tree->col_num;
      if (0.5 <= tree->pct_tree_left) {
        pcVar6 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar6,pcVar6 + pbVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_e0);
      }
      else {
        pcVar6 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar6,pcVar6 + pbVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_e0);
      }
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    }
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,
                                (ulong)(categ_colnames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[tree->col_num].
                                       _M_dataplus._M_p);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_120.field_2._M_allocated_capacity = *psVar11;
      local_120.field_2._8_8_ = plVar8[3];
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar11;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_100.field_2._M_allocated_capacity = *psVar11;
      local_100.field_2._8_8_ = plVar8[3];
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar11;
      local_100._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_100._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,
                                *(ulong *)(*(long *)&(categ_levels->
                                                                                                          
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                          (long)tree->chosen_cat * 0x20));
    paVar1 = &local_140.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_160.field_2._M_allocated_capacity = *psVar11;
      local_160.field_2._8_8_ = plVar8[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar11;
      local_160._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_160._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_120.field_2;
    paVar3 = &local_100.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar3) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    paVar4 = &local_e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar4) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar4;
    if (local_b8->missing_action == Impute) {
      pbVar7 = (categ_colnames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + tree->col_num;
      if (0.5 <= tree->pct_tree_left) {
        pcVar6 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar6,pcVar6 + pbVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_e0);
      }
      else {
        pcVar6 = (pbVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar6,pcVar6 + pbVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_e0);
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    }
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,
                                (ulong)(categ_colnames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[tree->col_num].
                                       _M_dataplus._M_p);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_120.field_2._M_allocated_capacity = *puVar12;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar12;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_100.field_2._M_allocated_capacity = *psVar11;
      local_100.field_2._8_8_ = plVar8[3];
      local_100._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar11;
      local_100._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_100._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,
                                *(ulong *)(*(long *)&(categ_levels->
                                                                                                          
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [tree->col_num].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                          (long)tree->chosen_cat * 0x20));
    puVar12 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_140.field_2._M_allocated_capacity = *puVar12;
      local_140.field_2._8_8_ = plVar8[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar12;
      local_140._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_140._M_string_length = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    psVar11 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_160.field_2._M_allocated_capacity = *psVar11;
      local_160.field_2._8_8_ = puVar9[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar11;
      local_160._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_160._M_string_length = puVar9[1];
    *puVar9 = psVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_c0,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar3) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    _Var17._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar4) {
      return;
    }
    goto LAB_003521e4;
  }
  if (tree->col_type != Numeric) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Unexpected error in ","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/sql.cpp"
               ,"");
    std::operator+(&local_120,&local_e0,&local_70);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,":","");
    std::operator+(&local_100,&local_120,&local_90);
    std::__cxx11::to_string(&local_50,0x218);
    std::operator+(&local_140,&local_100,&local_50);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
               ,"");
    std::operator+(&local_160,&local_140,&local_b0);
    std::runtime_error::runtime_error(this,(string *)&local_160);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_b8->missing_action == Impute) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    pbVar7 = (numeric_colnames->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + tree->col_num;
    if (0.5 <= tree->pct_tree_left) {
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar6,pcVar6 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_120);
    }
    else {
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar6,pcVar6 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_120);
    }
  }
  else {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  }
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,
                              (ulong)(numeric_colnames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[tree->col_num].
                                     _M_dataplus._M_p);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100.field_2._8_8_ = plVar8[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_100._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar1 = &local_140.field_2;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_140.field_2._M_allocated_capacity = *puVar12;
    local_140.field_2._8_8_ = plVar8[3];
    local_140._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_140.field_2._M_allocated_capacity = *puVar12;
    local_140._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_140._M_string_length = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_e0,vsnprintf,0x148,"%f",tree->num_split)
  ;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    uVar16 = local_140.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_e0._M_string_length + local_140._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar16 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_e0._M_string_length + local_140._M_string_length) goto LAB_00351892;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_e0,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
  }
  else {
LAB_00351892:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0._M_dataplus._M_p);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160.field_2._8_8_ = puVar9[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_160._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  std::__cxx11::string::operator=((string *)cond_left,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)paVar3;
  if (local_b8->missing_action == Impute) {
    pbVar7 = (numeric_colnames->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + tree->col_num;
    if (0.5 <= tree->pct_tree_left) {
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar6,pcVar6 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_120);
    }
    else {
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar6,pcVar6 + pbVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_120);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  }
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,
                              (ulong)(numeric_colnames->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[tree->col_num].
                                     _M_dataplus._M_p);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100.field_2._8_8_ = plVar8[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_100._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_100);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_140.field_2._M_allocated_capacity = *puVar12;
    local_140.field_2._8_8_ = plVar8[3];
    local_140._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_140.field_2._M_allocated_capacity = *puVar12;
    local_140._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_140._M_string_length = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_e0,vsnprintf,0x148,"%f",tree->num_split)
  ;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    uVar16 = local_140.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_e0._M_string_length + local_140._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      uVar16 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_e0._M_string_length + local_140._M_string_length) goto LAB_00351b50;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_e0,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
  }
  else {
LAB_00351b50:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0._M_dataplus._M_p);
  }
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160.field_2._8_8_ = puVar9[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar11;
    local_160._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_160._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  std::__cxx11::string::operator=((string *)local_c0,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_e0.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
  _Var17._M_p = local_120._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar3) {
    return;
  }
LAB_003521e4:
  operator_delete(_Var17._M_p,local_e0.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void extract_cond_isotree(const IsoForest &model, const IsoTree &tree,
                          std::string &cond_left, std::string &cond_right,
                          const std::vector<std::string> &numeric_colnames,
                          const std::vector<std::string> &categ_colnames,
                          const std::vector<std::vector<std::string>> &categ_levels)
{
    cond_left = std::string("");
    cond_right = std::string("");
    // if (tree.score >= 0.)
    if (tree.tree_left == 0)
        return;

    switch(tree.col_type)
    {
        case Numeric:
        {
            cond_left = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")))
                            + numeric_colnames[tree.col_num]
                            + " <= "
                            + std::to_string(tree.num_split);
            cond_right = ((model.missing_action != Impute)? "" :
                            ((tree.pct_tree_left >= .5)?
                                (numeric_colnames[tree.col_num]
                                    + " IS NOT NULL AND ")
                                :
                                (numeric_colnames[tree.col_num]
                                    + " IS NULL OR ")))
                            + numeric_colnames[tree.col_num]
                            + " > "
                            + std::to_string(tree.num_split);
            break;
        }

        case Categorical:
        {
            switch(model.cat_split_type)
            {
                case SingleCateg:
                {
                    cond_left = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")))
                                    + categ_colnames[tree.col_num]
                                    + " = '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    cond_right = ((model.missing_action != Impute)? "" :
                                    ((model.missing_action == Impute && tree.pct_tree_left >= .5)?
                                        (categ_colnames[tree.col_num]
                                            + " IS NOT NULL AND ")
                                        :
                                        (categ_colnames[tree.col_num]
                                            + " IS NULL OR ")))
                                    + categ_colnames[tree.col_num]
                                    + " != '"
                                    + categ_levels[tree.col_num][tree.chosen_cat]
                                    + "'";
                    break;
                }

                case SubSet:
                {
                    cond_left = categ_colnames[tree.col_num] + " IN (";
                    cond_right = cond_left;
                    if (model.missing_action == Impute)
                    {
                        if (tree.pct_tree_left >= .5)
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NULL OR " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_right;
                        }

                        else
                        {
                            cond_left = categ_colnames[tree.col_num] + " IS NOT NULL AND " + cond_left;
                            cond_right = categ_colnames[tree.col_num] + " IS NULL OR " + cond_right;
                        }
                    }
                    bool added_left = false;
                    bool added_right = false;
                    for (size_t categ = 0; categ < tree.cat_split.size(); categ++)
                    {
                        switch(tree.cat_split[categ])
                        {
                            case 1:
                            {
                                cond_left.append(
                                    std::string((added_left)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_left = true;
                                break;
                            }

                            case 0:
                            {
                                cond_right.append(
                                    std::string((added_right)? ", " : "")
                                    + "'"
                                    + categ_levels[tree.col_num][categ]
                                    + "'"
                                );
                                added_right = true;
                                break;
                            }

                            case -1:
                            {
                                if (model.new_cat_action == Smallest || model.missing_action == Impute)
                                {
                                    if ((model.new_cat_action == Smallest && tree.pct_tree_left < .5) ||
                                        (model.missing_action == Impute && tree.pct_tree_left >= .5))
                                    {
                                        cond_left.append(
                                            std::string((added_left)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_left = true;
                                    }
                                    else
                                    {
                                        cond_right.append(
                                            std::string((added_right)? ", " : "")
                                            + "'"
                                            + categ_levels[tree.col_num][categ]
                                            + "'"
                                        );
                                        added_right = true;
                                    }
                                }
                                break;
                            }
                        }
                    }
                    if (added_left)
                        cond_left += ")";
                    else
                        cond_left = "";
                    if (added_right)
                        cond_right += ")";
                    else
                        cond_right = "";

                    break;
                }
            }
            break;
        }

        default:
        {
            unexpected_error();
            break;
        }
    }
}